

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_int64 sqlite3StmtCurrentTime(sqlite3_context *p)

{
  int iVar1;
  i64 *pTimeOut;
  sqlite3_int64 *piTime;
  int rc;
  sqlite3_context *p_local;
  
  pTimeOut = &p->pVdbe->iCurrentTime;
  if ((*pTimeOut == 0) &&
     (iVar1 = sqlite3OsCurrentTimeInt64(p->pOut->db->pVfs,pTimeOut), iVar1 != 0)) {
    *pTimeOut = 0;
  }
  return *pTimeOut;
}

Assistant:

SQLITE_PRIVATE sqlite3_int64 sqlite3StmtCurrentTime(sqlite3_context *p){
  int rc;
#ifndef SQLITE_ENABLE_STAT3_OR_STAT4
  sqlite3_int64 *piTime = &p->pVdbe->iCurrentTime;
  assert( p->pVdbe!=0 );
#else
  sqlite3_int64 iTime = 0;
  sqlite3_int64 *piTime = p->pVdbe!=0 ? &p->pVdbe->iCurrentTime : &iTime;
#endif
  if( *piTime==0 ){
    rc = sqlite3OsCurrentTimeInt64(p->pOut->db->pVfs, piTime);
    if( rc ) *piTime = 0;
  }
  return *piTime;
}